

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcread.c
# Opt level: O0

void bcread_error(LexState *ls,ErrMsg em)

{
  int in_ESI;
  long in_RDI;
  char *name;
  lua_State *L;
  int in_stack_ffffffffffffffdc;
  char *L_00;
  
  L_00 = *(char **)(in_RDI + 0x70);
  if ((char)(((lua_State *)L_00)->nextgc).gcptr32 == '\x1b') {
    L_00 = "(binary)";
  }
  else if (((char)(((lua_State *)L_00)->nextgc).gcptr32 == '@') ||
          ((char)(((lua_State *)L_00)->nextgc).gcptr32 == '=')) {
    L_00 = (char *)((long)&(((lua_State *)L_00)->nextgc).gcptr32 + 1);
  }
  lj_strfmt_pushf(*(lua_State **)(in_RDI + 8),"%s: %s",L_00,lj_err_allmsg + in_ESI);
  lj_err_throw((lua_State *)L_00,in_stack_ffffffffffffffdc);
}

Assistant:

static LJ_NOINLINE void bcread_error(LexState *ls, ErrMsg em)
{
  lua_State *L = ls->L;
  const char *name = ls->chunkarg;
  if (*name == BCDUMP_HEAD1) name = "(binary)";
  else if (*name == '@' || *name == '=') name++;
  lj_strfmt_pushf(L, "%s: %s", name, err2msg(em));
  lj_err_throw(L, LUA_ERRSYNTAX);
}